

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O0

RK_S32 mpp_slots_get_unused_count(MppBufSlots slots)

{
  undefined1 local_30 [8];
  AutoMutex auto_lock;
  MppBufSlotsImpl *impl;
  MppBufSlots slots_local;
  
  if (slots == (MppBufSlots)0x0) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_slots_get_unused_count");
    slots_local._4_4_ = -3;
  }
  else {
    auto_lock.mLock = (Mutex *)slots;
    Mutex::Autolock::Autolock((Autolock *)local_30,*slots,1);
    if ((*(int *)((long)&auto_lock.mLock[2].mMutex + 0x14) < 0) ||
       (auto_lock.mLock[2].mMutex.__data.__kind < *(int *)((long)&auto_lock.mLock[2].mMutex + 0x14))
       ) {
      _dump_slots("mpp_slots_get_unused_count",(MppBufSlotsImpl *)auto_lock.mLock);
      _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "(impl->used_count >= 0) && (impl->used_count <= impl->buf_count)",
                 "mpp_slots_get_unused_count",0x53c);
      abort();
    }
    slots_local._4_4_ =
         auto_lock.mLock[2].mMutex.__data.__kind - *(int *)((long)&auto_lock.mLock[2].mMutex + 0x14)
    ;
    Mutex::Autolock::~Autolock((Autolock *)local_30);
  }
  return slots_local._4_4_;
}

Assistant:

RK_S32 mpp_slots_get_unused_count(MppBufSlots slots)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    slot_assert(impl, (impl->used_count >= 0) && (impl->used_count <= impl->buf_count));
    return impl->buf_count - impl->used_count;
}